

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O0

void cfl_predict_lbd_32x8_c(int16_t *pred_buf_q3,uint8_t *dst,int dst_stride,int alpha_q3)

{
  int in_ECX;
  int in_EDX;
  undefined8 in_RSI;
  uint8_t *in_RDI;
  
  cfl_predict_lbd_c((int16_t *)CONCAT44(dst_stride,alpha_q3),in_RDI,(int)((ulong)in_RSI >> 0x20),
                    (int)in_RSI,in_EDX,in_ECX);
  return;
}

Assistant:

static inline void cfl_predict_hbd_c(const int16_t *ac_buf_q3, uint16_t *dst,
                                     int dst_stride, int alpha_q3,
                                     int bit_depth, int width, int height) {
  for (int j = 0; j < height; j++) {
    for (int i = 0; i < width; i++) {
      dst[i] = clip_pixel_highbd(
          get_scaled_luma_q0(alpha_q3, ac_buf_q3[i]) + dst[i], bit_depth);
    }
    dst += dst_stride;
    ac_buf_q3 += CFL_BUF_LINE;
  }
}